

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

void RTMath::convertToVector(uchar *rawData,RTVector3 *vec,RTFLOAT scale,bool bigEndian)

{
  ushort uVar1;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,bigEndian) == 0) {
    vec->m_data[0] = (float)(int)*(short *)rawData * scale;
    vec->m_data[1] = (float)(int)*(short *)(rawData + 2) * scale;
    uVar1 = *(ushort *)(rawData + 4);
  }
  else {
    vec->m_data[0] = (float)(int)(short)(*(ushort *)rawData << 8 | *(ushort *)rawData >> 8) * scale;
    vec->m_data[1] =
         (float)(int)(short)(*(ushort *)(rawData + 2) << 8 | *(ushort *)(rawData + 2) >> 8) * scale;
    uVar1 = *(ushort *)(rawData + 4) << 8 | *(ushort *)(rawData + 4) >> 8;
  }
  vec->m_data[2] = (float)(int)(short)uVar1 * scale;
  return;
}

Assistant:

void RTMath::convertToVector(unsigned char *rawData, RTVector3& vec, RTFLOAT scale, bool bigEndian)
{
    if (bigEndian) {
        vec.setX((RTFLOAT)((int16_t)(((uint16_t)rawData[0] << 8) | (uint16_t)rawData[1])) * scale);
        vec.setY((RTFLOAT)((int16_t)(((uint16_t)rawData[2] << 8) | (uint16_t)rawData[3])) * scale);
        vec.setZ((RTFLOAT)((int16_t)(((uint16_t)rawData[4] << 8) | (uint16_t)rawData[5])) * scale);
    } else {
        vec.setX((RTFLOAT)((int16_t)(((uint16_t)rawData[1] << 8) | (uint16_t)rawData[0])) * scale);
        vec.setY((RTFLOAT)((int16_t)(((uint16_t)rawData[3] << 8) | (uint16_t)rawData[2])) * scale);
        vec.setZ((RTFLOAT)((int16_t)(((uint16_t)rawData[5] << 8) | (uint16_t)rawData[4])) * scale);
     }
}